

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

void Sfm_DecVarCost(Sfm_Dec_t *p,word (*Masks) [8],int d,int (*Counts) [2])

{
  int iVar1;
  uint uVar2;
  word *x;
  word (*pawVar3) [8];
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  lVar4 = 0;
  pawVar3 = Masks;
  do {
    if (lVar4 == 2) {
      return;
    }
    x = Sfm_DecDivPats(p,d,(int)lVar4);
    uVar2 = p->nPatWords[lVar4];
    uVar5 = 0;
    uVar6 = 0;
    if (0 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    iVar7 = 0;
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      iVar1 = Abc_TtCountOnes((*pawVar3)[uVar5]);
      iVar7 = iVar7 + iVar1;
    }
    uVar2 = Abc_TtCountOnesVecMask(x,Masks[lVar4],uVar2,0);
    Counts[lVar4][1] = uVar2;
    Counts[lVar4][0] = iVar7 - uVar2;
    lVar4 = lVar4 + 1;
    pawVar3 = pawVar3 + 1;
  } while (-1 < (int)(iVar7 - uVar2 | uVar2));
  __assert_fail("Counts[c][0] >= 0 && Counts[c][1] >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                ,0x274,"void Sfm_DecVarCost(Sfm_Dec_t *, word (*)[8], int, int (*)[2])");
}

Assistant:

void Sfm_DecVarCost( Sfm_Dec_t * p, word Masks[2][SFM_SIM_WORDS], int d, int Counts[2][2] )
{
    int c; 
    for ( c = 0; c < 2; c++ )
    {
        word * pPats = Sfm_DecDivPats( p, d, c );
        int Num = Abc_TtCountOnesVec( Masks[c], p->nPatWords[c] );
        Counts[c][1] = Abc_TtCountOnesVecMask( pPats, Masks[c], p->nPatWords[c], 0 );
        Counts[c][0] = Num - Counts[c][1];
        assert( Counts[c][0] >= 0 && Counts[c][1] >= 0 );
    }
    //printf( "%5d %5d   %5d %5d \n", Counts[0][0], Counts[0][1], Counts[1][0], Counts[1][1] );
}